

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     lods<unsigned_char,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,unsigned_short *eSI,uchar *eAX,
               Context *context)

{
  type_conflict3 tVar1;
  
  if (*eCX != 0) {
    tVar1 = PCCompatible::Memory::access<unsigned_char,(InstructionSet::x86::AccessType)0>
                      (&context->memory,(Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES
                       ,*eSI);
    *eAX = tVar1;
    *eSI = *eSI + (short)(context->flags).direction_;
    *eCX = *eCX - 1;
    if (*eCX != 0) {
      (context->flow_controller).should_repeat_ = true;
    }
  }
  return;
}

Assistant:

bool repetition_over(
	const AddressT &eCX
) {
	return repetition != Repetition::None && !eCX;
}